

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceDirectional::~IfcLightSourceDirectional
          (IfcLightSourceDirectional *this)

{
  undefined1 *puVar1;
  Maybe<double> *pMVar2;
  
  *(undefined8 *)&this[-1].super_IfcLightSource.super_IfcGeometricRepresentationItem.field_0x30 =
       0x927818;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18 = 0x927890;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x40 = 0x927840;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x50 = 0x927868;
  puVar1 = (undefined1 *)this[-1].super_IfcLightSource.AmbientIntensity.ptr;
  pMVar2 = &this[-1].super_IfcLightSource.Intensity;
  if ((Maybe<double> *)puVar1 != pMVar2) {
    operator_delete(puVar1,(long)pMVar2->ptr + 1);
  }
  operator_delete(&this[-1].super_IfcLightSource.super_IfcGeometricRepresentationItem.field_0x30,
                  0xb0);
  return;
}

Assistant:

IfcLightSource() : Object("IfcLightSource") {}